

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::RgbaInputFile::setLayerName(RgbaInputFile *this,string *layerName)

{
  RgbaChannels RVar1;
  _func_int **pp_Var2;
  undefined8 in_RSI;
  InputFile *in_RDI;
  FromYca *unaff_retaddr;
  FrameBuffer fb;
  RgbaChannels rgbaChannels;
  FrameBuffer *in_stack_00000218;
  InputFile *in_stack_00000220;
  RgbaInputFile *in_stack_ffffffffffffff60;
  FromYca *in_stack_ffffffffffffff70;
  Header *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  string local_30 [36];
  RgbaChannels rgbaChannels_00;
  InputFile *inputFile;
  
  rgbaChannels_00 = (RgbaChannels)((ulong)in_RSI >> 0x20);
  pp_Var2 = in_RDI[1].super_GenericInputFile._vptr_GenericInputFile;
  inputFile = in_RDI;
  if (pp_Var2 != (_func_int **)0x0) {
    FromYca::~FromYca(in_stack_ffffffffffffff70);
    operator_delete(pp_Var2,0x188);
  }
  in_RDI[1].super_GenericInputFile._vptr_GenericInputFile = (_func_int **)0x0;
  InputFile::header((InputFile *)in_RDI->_data);
  anon_unknown_1::prefixFromLayerName(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::__cxx11::string::operator=((string *)&in_RDI[1]._data,local_30);
  std::__cxx11::string::~string(local_30);
  RVar1 = channels(in_stack_ffffffffffffff60);
  if ((RVar1 & WRITE_YC) != 0) {
    pp_Var2 = (_func_int **)operator_new(0x188);
    FromYca::FromYca(unaff_retaddr,inputFile,rgbaChannels_00);
    in_RDI[1].super_GenericInputFile._vptr_GenericInputFile = pp_Var2;
  }
  FrameBuffer::FrameBuffer((FrameBuffer *)0x246a5f);
  InputFile::setFrameBuffer(in_stack_00000220,in_stack_00000218);
  FrameBuffer::~FrameBuffer((FrameBuffer *)0x246a7e);
  return;
}

Assistant:

void
RgbaInputFile::setLayerName (const string &layerName)
{
    delete _fromYca;
    _fromYca = 0;

    _channelNamePrefix = prefixFromLayerName (layerName, _inputFile->header());

    RgbaChannels rgbaChannels = channels();

    if (rgbaChannels & (WRITE_Y | WRITE_C))
	_fromYca = new FromYca (*_inputFile, rgbaChannels);

    FrameBuffer fb;
    _inputFile->setFrameBuffer (fb);
}